

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void copyNodeContent(MemPage *pFrom,MemPage *pTo,int *pRC)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  MemPage *in_RDX;
  undefined1 *in_RSI;
  long in_RDI;
  int iData;
  int rc;
  int iToHdr;
  int iFromHdr;
  u8 *aTo;
  u8 *aFrom;
  BtShared *pBt;
  int local_3c;
  MemPage *pPage;
  
  iVar5._0_1_ = in_RDX->isInit;
  iVar5._1_1_ = in_RDX->intKey;
  iVar5._2_1_ = in_RDX->intKeyLeaf;
  iVar5._3_1_ = in_RDX->field_0x3;
  if (iVar5 == 0) {
    pPage = *(MemPage **)(in_RDI + 0x48);
    lVar1 = *(long *)(in_RDI + 0x50);
    lVar2 = *(long *)(in_RSI + 0x50);
    uVar3 = (uint)*(byte *)(in_RDI + 9);
    iVar5 = 0;
    if (*(int *)(in_RSI + 4) == 1) {
      iVar5 = 100;
    }
    uVar4 = (uint)CONCAT11(*(undefined1 *)(lVar1 + (int)(uVar3 + 5)),
                           *(undefined1 *)(lVar1 + 1 + (long)(int)(uVar3 + 5)));
    memcpy((void *)(lVar2 + (int)uVar4),(void *)(lVar1 + (int)uVar4),
           (ulong)(*(int *)(pPage->apOvfl + 2) - uVar4));
    memcpy((void *)(lVar2 + iVar5),(void *)(lVar1 + (int)uVar3),
           (long)(int)((uint)*(ushort *)(in_RDI + 0x12) + (uint)*(ushort *)(in_RDI + 0x18) * 2));
    *in_RSI = 0;
    local_3c = btreeInitPage((MemPage *)CONCAT44(uVar3,iVar5));
    if (local_3c == 0) {
      local_3c = btreeComputeFreeSpace(in_RDX);
    }
    if (local_3c == 0) {
      if (*(char *)((long)pPage->aiOvfl + 5) != '\0') {
        iVar5 = setChildPtrmaps(pPage);
        in_RDX->isInit = (char)iVar5;
        in_RDX->intKey = (char)((uint)iVar5 >> 8);
        in_RDX->intKeyLeaf = (char)((uint)iVar5 >> 0x10);
        in_RDX->field_0x3 = (char)((uint)iVar5 >> 0x18);
      }
    }
    else {
      in_RDX->isInit = (undefined1)local_3c;
      in_RDX->intKey = local_3c._1_1_;
      in_RDX->intKeyLeaf = local_3c._2_1_;
      in_RDX->field_0x3 = local_3c._3_1_;
    }
  }
  return;
}

Assistant:

static void copyNodeContent(MemPage *pFrom, MemPage *pTo, int *pRC){
  if( (*pRC)==SQLITE_OK ){
    BtShared * const pBt = pFrom->pBt;
    u8 * const aFrom = pFrom->aData;
    u8 * const aTo = pTo->aData;
    int const iFromHdr = pFrom->hdrOffset;
    int const iToHdr = ((pTo->pgno==1) ? 100 : 0);
    int rc;
    int iData;


    assert( pFrom->isInit );
    assert( pFrom->nFree>=iToHdr );
    assert( get2byte(&aFrom[iFromHdr+5]) <= (int)pBt->usableSize );

    /* Copy the b-tree node content from page pFrom to page pTo. */
    iData = get2byte(&aFrom[iFromHdr+5]);
    memcpy(&aTo[iData], &aFrom[iData], pBt->usableSize-iData);
    memcpy(&aTo[iToHdr], &aFrom[iFromHdr], pFrom->cellOffset + 2*pFrom->nCell);

    /* Reinitialize page pTo so that the contents of the MemPage structure
    ** match the new data. The initialization of pTo can actually fail under
    ** fairly obscure circumstances, even though it is a copy of initialized
    ** page pFrom.
    */
    pTo->isInit = 0;
    rc = btreeInitPage(pTo);
    if( rc==SQLITE_OK ) rc = btreeComputeFreeSpace(pTo);
    if( rc!=SQLITE_OK ){
      *pRC = rc;
      return;
    }

    /* If this is an auto-vacuum database, update the pointer-map entries
    ** for any b-tree or overflow pages that pTo now contains the pointers to.
    */
    if( ISAUTOVACUUM(pBt) ){
      *pRC = setChildPtrmaps(pTo);
    }
  }
}